

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

IsoHeaderData * IsoHeaderData::normal(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  time_t tVar5;
  IsoHeaderData *in_RDI;
  ulong uVar6;
  undefined8 uVar7;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  uint32_t local_24;
  
  (in_RDI->appId)._M_dataplus._M_p = (pointer)&(in_RDI->appId).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"*tsMuxeR git-7f8667d","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*tsMuxeR ","");
  local_24 = random32();
  int32uToHex_abi_cxx11_(&local_68,&local_24);
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < local_68._M_string_length + local_40) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_40 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00190f70;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
LAB_00190f70:
  paVar1 = &(in_RDI->impId).field_2;
  (in_RDI->impId)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar7 = puVar4[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(in_RDI->impId).field_2 + 8) = uVar7;
  }
  else {
    (in_RDI->impId)._M_dataplus._M_p = (pointer)*puVar4;
    (in_RDI->impId).field_2._M_allocated_capacity = *psVar2;
  }
  (in_RDI->impId)._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  tVar5 = time((time_t *)0x0);
  in_RDI->fileTime = tVar5;
  uVar3 = random32();
  in_RDI->volumeId = uVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return in_RDI;
}

Assistant:

IsoHeaderData IsoHeaderData::normal()
{
    return IsoHeaderData{"*tsMuxeR " TSMUXER_VERSION, std::string("*tsMuxeR ") + int32uToHex(random32()), time(nullptr),
                         random32()};
}